

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O3

bool f8n::env::fs::DeleteFile(string *path)

{
  int iVar1;
  
  iVar1 = remove((path->_M_dataplus)._M_p);
  return iVar1 == 0;
}

Assistant:

bool DeleteFile(const std::string& path) {
#ifdef WIN32
        std::wstring path16 = u8to16(path.c_str());
        return ::DeleteFile(path16.c_str()) == TRUE;
#else
        return std::remove(path.c_str()) == 0;
#endif
    }